

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlUTF8Strloc(xmlChar *utf,xmlChar *utfchar)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  
  iVar4 = -1;
  if (utfchar != (xmlChar *)0x0 && utf != (xmlChar *)0x0) {
    iVar2 = xmlUTF8Strsize(utfchar,1);
    bVar5 = *utf;
    if (bVar5 != 0) {
      uVar3 = 0;
      while ((0 < iVar2 && (utf != utfchar))) {
        lVar6 = 0;
        while (pbVar1 = utf + lVar6, *pbVar1 == utfchar[lVar6]) {
          if ((iVar2 + -1 == (int)lVar6) || (lVar6 = lVar6 + 1, *pbVar1 == 0)) goto LAB_001cf235;
        }
        utf = utf + 1;
        if ((char)bVar5 < '\0') {
          if ((~bVar5 & 0xc0) != 0) {
            return -1;
          }
          if ((bVar5 & 0x40) != 0) {
            return -1;
          }
        }
        uVar3 = uVar3 + 1;
        bVar5 = *utf;
        if (bVar5 == 0) {
          return -1;
        }
      }
LAB_001cf235:
      iVar4 = (int)uVar3;
      if (0x7fffffff < uVar3) {
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlUTF8Strloc(const xmlChar *utf, const xmlChar *utfchar) {
    size_t i;
    int size;
    int ch;

    if (utf==NULL || utfchar==NULL) return -1;
    size = xmlUTF8Strsize(utfchar, 1);
        for(i=0; (ch=*utf) != 0; i++) {
            if (xmlStrncmp(utf, utfchar, size)==0)
                return(i > INT_MAX ? 0 : i);
            utf++;
            if ( ch & 0x80 ) {
                /* if not simple ascii, verify proper format */
                if ( (ch & 0xc0) != 0xc0 )
                    return(-1);
                /* then skip over remaining bytes for this char */
                while ( (ch <<= 1) & 0x80 )
                    if ( (*utf++ & 0xc0) != 0x80 )
                        return(-1);
            }
        }

    return(-1);
}